

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

void __thiscall tcmalloc::PageHeap::GetLargeSpanStatsLocked(PageHeap *this,LargeSpanStats *result)

{
  bool bVar1;
  pointer pSVar2;
  _Self local_38;
  _Self local_30;
  SpanSetIter it_1;
  _Self local_20;
  SpanSetIter it;
  LargeSpanStats *result_local;
  PageHeap *this_local;
  
  result->spans = 0;
  result->normal_pages = 0;
  result->returned_pages = 0;
  it._M_node = (_Base_ptr)result;
  local_20._M_node =
       (_Base_ptr)
       std::
       set<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
       ::begin(&this->large_normal_);
  while( true ) {
    it_1._M_node = (_Base_ptr)
                   std::
                   set<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
                   ::end(&this->large_normal_);
    bVar1 = std::operator!=(&local_20,&it_1);
    if (!bVar1) break;
    pSVar2 = std::_Rb_tree_const_iterator<tcmalloc::SpanPtrWithLength>::operator->(&local_20);
    (it._M_node)->_M_parent = (_Base_ptr)((long)&(it._M_node)->_M_parent->_M_color + pSVar2->length)
    ;
    *(long *)it._M_node = *(long *)it._M_node + 1;
    std::_Rb_tree_const_iterator<tcmalloc::SpanPtrWithLength>::operator++(&local_20);
  }
  local_30._M_node =
       (_Base_ptr)
       std::
       set<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
       ::begin(&this->large_returned_);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         set<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
         ::end(&this->large_returned_);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    pSVar2 = std::_Rb_tree_const_iterator<tcmalloc::SpanPtrWithLength>::operator->(&local_30);
    (it._M_node)->_M_left = (_Base_ptr)((long)&(it._M_node)->_M_left->_M_color + pSVar2->length);
    *(long *)it._M_node = *(long *)it._M_node + 1;
    std::_Rb_tree_const_iterator<tcmalloc::SpanPtrWithLength>::operator++(&local_30);
  }
  return;
}

Assistant:

void PageHeap::GetLargeSpanStatsLocked(LargeSpanStats* result) {
  ASSERT(lock_.IsHeld());
  result->spans = 0;
  result->normal_pages = 0;
  result->returned_pages = 0;
  for (SpanSetIter it = large_normal_.begin(); it != large_normal_.end(); ++it) {
    result->normal_pages += it->length;
    result->spans++;
  }
  for (SpanSetIter it = large_returned_.begin(); it != large_returned_.end(); ++it) {
    result->returned_pages += it->length;
    result->spans++;
  }
}